

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mi_heap_buf_print_count_bin
               (mi_heap_buf_t *hbuf,char *prefix,mi_stat_count_t *stat,size_t bin,_Bool add_comma)

{
  mi_heap_buf_t *hbuf_00;
  size_t in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  byte in_R8B;
  char buf [128];
  size_t pagesize;
  size_t binsize;
  char *local_d0;
  char local_c8 [127];
  undefined1 local_49;
  char *local_40;
  size_t local_38;
  byte local_29;
  
  local_29 = in_R8B & 1;
  local_38 = _mi_bin_size(in_RCX);
  if (local_38 < 0x2001) {
    local_d0 = (char *)0x10000;
  }
  else {
    local_d0 = (char *)0x0;
    if (local_38 < 0x10001) {
      local_d0 = (char *)0x80000;
    }
  }
  local_40 = local_d0;
  hbuf_00 = (mi_heap_buf_t *)0x48171a;
  if ((local_29 & 1) != 0) {
    hbuf_00 = (mi_heap_buf_t *)0x4848a0;
  }
  _mi_snprintf(local_c8,0x80,
               "%s{ \"total\": %lld, \"peak\": %lld, \"current\": %lld, \"block_size\": %zu, \"page_size\": %zu }%s\n"
               ,in_RSI,*in_RDX,in_RDX[1],in_RDX[2],local_38);
  local_49 = 0;
  mi_heap_buf_print(hbuf_00,local_d0);
  return;
}

Assistant:

static void mi_heap_buf_print_count_bin(mi_heap_buf_t* hbuf, const char* prefix, mi_stat_count_t* stat, size_t bin, bool add_comma) {
  const size_t binsize = _mi_bin_size(bin);
  const size_t pagesize = (binsize <= MI_SMALL_OBJ_SIZE_MAX ? MI_SMALL_PAGE_SIZE :
                            (binsize <= MI_MEDIUM_OBJ_SIZE_MAX ? MI_MEDIUM_PAGE_SIZE :
                              #if MI_LARGE_PAGE_SIZE
                              (binsize <= MI_LARGE_OBJ_SIZE_MAX ? MI_LARGE_PAGE_SIZE : 0)
                              #else
                              0
                              #endif
                              ));
  char buf[128];
  _mi_snprintf(buf, 128, "%s{ \"total\": %lld, \"peak\": %lld, \"current\": %lld, \"block_size\": %zu, \"page_size\": %zu }%s\n", prefix, stat->total, stat->peak, stat->current, binsize, pagesize, (add_comma ? "," : ""));
  buf[127] = 0;
  mi_heap_buf_print(hbuf, buf);
}